

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O2

wchar_t terminal__putc(EditLine *el,wint_t c)

{
  uint uVar1;
  wchar_t wVar2;
  ulong uVar3;
  char *__s;
  char buf [17];
  
  if (c == 0xffffffff) {
    uVar3 = 0;
  }
  else {
    if ((int)c < 0) {
      __s = literal_get(el,c);
      wVar2 = fputs(__s,(FILE *)el->el_outfile);
      return wVar2;
    }
    uVar3 = ct_encode_char(buf,0x10,c);
    if (0 < (long)uVar3) {
      buf[uVar3] = '\0';
      uVar1 = fputs(buf,(FILE *)el->el_outfile);
      uVar3 = (ulong)uVar1;
    }
  }
  return (wchar_t)uVar3;
}

Assistant:

libedit_private int
terminal__putc(EditLine *el, wint_t c)
{
	char buf[MB_LEN_MAX +1];
	ssize_t i;
	if (c == MB_FILL_CHAR)
		return 0;
	if (c & EL_LITERAL)
		return fputs(literal_get(el, c), el->el_outfile);
	i = ct_encode_char(buf, (size_t)MB_LEN_MAX, c);
	if (i <= 0)
		return (int)i;
	buf[i] = '\0';
	return fputs(buf, el->el_outfile);
}